

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_get_defined_constants(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  jx9_value *pArray;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pValue = jx9_context_new_array(pCtx);
  if (pValue == (jx9_value *)0x0) {
    jx9_result_null(pCtx);
  }
  else {
    SyHashForEach(&pCtx->pVm->hConstant,VmHashConstStep,pValue);
    jx9_result_value(pCtx,pValue);
  }
  return 0;
}

Assistant:

static int vm_builtin_get_defined_constants(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray;
	/* Create the array first*/
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Fill the array with the defined constants */
	SyHashForEach(&pCtx->pVm->hConstant, VmHashConstStep, pArray);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}